

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# insert_ordered.h
# Opt level: O1

InsertOrderedSet<CFG::Block_*> * __thiscall
wasm::InsertOrderedMap<CFG::Block_*,_wasm::InsertOrderedSet<CFG::Block_*>_>::operator[]
          (InsertOrderedMap<CFG::Block_*,_wasm::InsertOrderedSet<CFG::Block_*>_> *this,Block **k)

{
  undefined8 *puVar1;
  _Hash_node_base *p_Var2;
  undefined8 *puVar3;
  pair<std::_List_iterator<std::pair<CFG::Block_*const,_wasm::InsertOrderedSet<CFG::Block_*>_>_>,_bool>
  pVar4;
  undefined1 local_d0 [8];
  pair<CFG::Block_*const,_wasm::InsertOrderedSet<CFG::Block_*>_> kv;
  undefined8 local_48;
  undefined8 *puStack_40;
  undefined8 *local_38;
  undefined8 uStack_30;
  
  kv.second.List.super__List_base<CFG::Block_*,_std::allocator<CFG::Block_*>_>._M_impl._M_node.
  _M_size = (size_t)&stack0xffffffffffffffb8;
  local_48 = 0;
  uStack_30 = 0;
  local_d0 = (undefined1  [8])*k;
  puStack_40 = &stack0xffffffffffffffc0;
  local_38 = &stack0xffffffffffffffc0;
  InsertOrderedSet<CFG::Block_*>::InsertOrderedSet
            ((InsertOrderedSet<CFG::Block_*> *)&kv,
             (InsertOrderedSet<CFG::Block_*> *)
             &kv.second.List.super__List_base<CFG::Block_*,_std::allocator<CFG::Block_*>_>._M_impl.
              _M_node._M_size);
  puVar3 = puStack_40;
  while ((undefined8 **)puVar3 != &stack0xffffffffffffffc0) {
    puVar1 = (undefined8 *)*puVar3;
    operator_delete(puVar3,0x18);
    puVar3 = puVar1;
  }
  std::
  _Hashtable<CFG::Block_*,_std::pair<CFG::Block_*const,_std::_List_iterator<CFG::Block_*>_>,_std::allocator<std::pair<CFG::Block_*const,_std::_List_iterator<CFG::Block_*>_>_>,_std::__detail::_Select1st,_std::equal_to<CFG::Block_*>,_std::hash<CFG::Block_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<CFG::Block_*,_std::pair<CFG::Block_*const,_std::_List_iterator<CFG::Block_*>_>,_std::allocator<std::pair<CFG::Block_*const,_std::_List_iterator<CFG::Block_*>_>_>,_std::__detail::_Select1st,_std::equal_to<CFG::Block_*>,_std::hash<CFG::Block_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)&kv.second.List.super__List_base<CFG::Block_*,_std::allocator<CFG::Block_*>_>.
                    _M_impl._M_node._M_size);
  pVar4 = insert(this,(pair<CFG::Block_*const,_wasm::InsertOrderedSet<CFG::Block_*>_> *)local_d0);
  while (kv.second.Map._M_h._M_single_bucket !=
         (__node_base_ptr)&kv.second.Map._M_h._M_single_bucket) {
    p_Var2 = (kv.second.Map._M_h._M_single_bucket)->_M_nxt;
    operator_delete(kv.second.Map._M_h._M_single_bucket,0x18);
    kv.second.Map._M_h._M_single_bucket = p_Var2;
  }
  std::
  _Hashtable<CFG::Block_*,_std::pair<CFG::Block_*const,_std::_List_iterator<CFG::Block_*>_>,_std::allocator<std::pair<CFG::Block_*const,_std::_List_iterator<CFG::Block_*>_>_>,_std::__detail::_Select1st,_std::equal_to<CFG::Block_*>,_std::hash<CFG::Block_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<CFG::Block_*,_std::pair<CFG::Block_*const,_std::_List_iterator<CFG::Block_*>_>,_std::allocator<std::pair<CFG::Block_*const,_std::_List_iterator<CFG::Block_*>_>_>,_std::__detail::_Select1st,_std::equal_to<CFG::Block_*>,_std::hash<CFG::Block_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)&kv);
  return (InsertOrderedSet<CFG::Block_*> *)&pVar4.first._M_node._M_node[1]._M_prev;
}

Assistant:

T& operator[](const Key& k) {
    std::pair<const Key, T> kv = {k, {}};
    return insert(kv).first->second;
  }